

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  XIO_HANDLE xio;
  uchar done;
  XIO_HANDLE tlsio;
  TLSIO_CONFIG tlsio_config;
  IO_INTERFACE_DESCRIPTION *tlsio_interface;
  int result;
  char **argv_local;
  int argc_local;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    tlsio_config._32_8_ = platform_get_default_tlsio();
    if ((IO_INTERFACE_DESCRIPTION *)tlsio_config._32_8_ == (IO_INTERFACE_DESCRIPTION *)0x0) {
      printf("Error getting tlsio interface description.");
      tlsio_interface._4_4_ = 0x45;
    }
    else {
      memcpy(&tlsio,&PTR_anon_var_dwarf_5c_00123ce0,0x28);
      xio = xio_create((IO_INTERFACE_DESCRIPTION *)tlsio_config._32_8_,&tlsio);
      if (xio == (XIO_HANDLE)0x0) {
        printf("Error creating TLS IO.");
        tlsio_interface._4_4_ = 0x50;
      }
      else {
        iVar1 = xio_open(xio,on_io_open_complete,xio,on_io_bytes_received,xio,on_io_error,xio);
        if (iVar1 == 0) {
          do {
            xio_dowork(xio);
          } while( true );
        }
        printf("Error opening TLS IO.");
        tlsio_interface._4_4_ = 0x57;
        xio_destroy(xio);
      }
    }
    platform_deinit();
  }
  else {
    printf("Cannot initialize platform.");
    tlsio_interface._4_4_ = 0x3d;
  }
  return tlsio_interface._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc, (void)argv;

    if (platform_init() != 0)
    {
        (void)printf("Cannot initialize platform.");
        result = MU_FAILURE;
    }
    else
    {
        const IO_INTERFACE_DESCRIPTION* tlsio_interface = platform_get_default_tlsio();
        if (tlsio_interface == NULL)
        {
            (void)printf("Error getting tlsio interface description.");
            result = MU_FAILURE;
        }
        else
        {
            TLSIO_CONFIG tlsio_config = { "www.google.com", 443, NULL, NULL};
            XIO_HANDLE tlsio;

            tlsio = xio_create(tlsio_interface, &tlsio_config);
            if (tlsio == NULL)
            {
                (void)printf("Error creating TLS IO.");
                result = MU_FAILURE;
            }
            else
            {
                if (xio_open(tlsio, on_io_open_complete, tlsio, on_io_bytes_received, tlsio, on_io_error, tlsio) != 0)
                {
                    (void)printf("Error opening TLS IO.");
                    result = MU_FAILURE;
                }
                else
                {
                    unsigned char done = 0;
                    while (!done)
                    {
                        xio_dowork(tlsio);
                    }

                    result = 0;
                }

                xio_destroy(tlsio);
            }
        }

        platform_deinit();
    }

    return result;
}